

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O0

_Bool is_valid_row(menu_conflict *menu,int cursor)

{
  int iVar1;
  int local_2c;
  int local_28;
  int count;
  int oid;
  int cursor_local;
  menu_conflict *menu_local;
  
  if (menu->filter_list == (int *)0x0) {
    local_28 = menu->count;
  }
  else {
    local_28 = menu->filter_count;
  }
  if ((cursor < 0) || (local_28 <= cursor)) {
    menu_local._7_1_ = false;
  }
  else {
    local_2c = cursor;
    if (menu->filter_list != (int *)0x0) {
      local_2c = menu->filter_list[cursor];
    }
    if (menu->row_funcs->valid_row == (_func_int_menu_ptr_int *)0x0) {
      menu_local._7_1_ = true;
    }
    else {
      iVar1 = (*menu->row_funcs->valid_row)(menu,local_2c);
      menu_local._7_1_ = iVar1 != 0;
    }
  }
  return menu_local._7_1_;
}

Assistant:

static bool is_valid_row(struct menu *menu, int cursor)
{
	int oid;
	int count = menu->filter_list ? menu->filter_count : menu->count;

	if (cursor < 0 || cursor >= count)
		return false;

	oid = menu->filter_list ? menu->filter_list[cursor] : cursor;

	if (menu->row_funcs->valid_row)
		return menu->row_funcs->valid_row(menu, oid);

	return true;
}